

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

natwm_error
array_context_get_delimiter(char *string,char delimiter,char **result,size_t *length,_Bool consume)

{
  size_t end;
  char c;
  _Bool _Var1;
  parser_token pVar2;
  natwm_error nVar3;
  stack *stack;
  stack_item *item;
  undefined7 in_register_00000081;
  char *local_60;
  char *resulting_string;
  size_t string_length;
  char **local_48;
  undefined4 local_3c;
  long local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000081,consume);
  string_length = (size_t)length;
  local_48 = result;
  stack = stack_create();
  local_38 = 0;
  while( true ) {
    c = string[local_38];
    if (c == '\0') {
      stack_destroy(stack);
      return NOT_FOUND_ERROR;
    }
    pVar2 = char_to_token(c);
    if (pVar2 == ARRAY_END) {
      item = stack_pop(stack);
      if (item != (stack_item *)0x0) {
        stack_item_destroy(item);
      }
    }
    else if (pVar2 == ARRAY_START) {
      stack_push(stack,&local_38);
    }
    if ((c == delimiter) && (_Var1 = stack_has_item(stack), !_Var1)) break;
    local_38 = local_38 + 1;
  }
  end = local_38 + (ulong)(byte)local_3c;
  local_60 = (char *)0x0;
  local_38 = (ulong)(byte)local_3c + local_38 + 1;
  resulting_string = (char *)0x0;
  nVar3 = string_splice(string,0,end,&local_60,(size_t *)&resulting_string);
  if (nVar3 == NO_ERROR) {
    *local_48 = local_60;
    *(char **)string_length = resulting_string;
  }
  stack_destroy(stack);
  return nVar3;
}

Assistant:

static enum natwm_error array_context_get_delimiter(const char *string, char delimiter,
                                                    char **result, size_t *length, bool consume)
{
        enum natwm_error err = GENERIC_ERROR;
        struct stack *stack = stack_create();
        size_t index = 0;
        char ch = '\0';

        while ((ch = string[index]) != '\0') {
                enum parser_token token = char_to_token(ch);

                if (token == ARRAY_START) {
                        stack_push(stack, &index);
                }

                if (token == ARRAY_END) {
                        // We just need to delete this
                        struct stack_item *stack_item = stack_pop(stack);

                        if (stack_item != NULL) {
                                stack_item_destroy(stack_item);
                        }
                }

                if (ch != delimiter) {
                        ++index;

                        continue;
                }

                // We found the delimiter - check if the stack is empty.
                if (!stack_has_item(stack)) {
                        // If we want to include the delimiter in the final
                        // string increment the index
                        if (consume) {
                                ++index;
                        }

                        ++index;

                        break;
                }

                // We found the delimiter, but we are not in the correct
                // context, so just incremement the index and continue
                ++index;

                continue;
        }

        if (ch == '\0') {
                // We did not find anything
                stack_destroy(stack);

                return NOT_FOUND_ERROR;
        }

        char *resulting_string = NULL;
        size_t string_length = 0;

        err = string_splice(string, 0, index - 1, &resulting_string, &string_length);

        if (err != NO_ERROR) {
                stack_destroy(stack);

                return err;
        }

        *result = resulting_string;
        *length = string_length;

        stack_destroy(stack);

        return NO_ERROR;
}